

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.cpp
# Opt level: O3

bool Format::FromSize(int64_t size,Format *fmt)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  
  if (size < 0x134000) {
    if (0x59fff < size) {
      if (size < 0xb4000) {
        if (size != 0x5a000) {
          if (size == 0xa0000) {
            fmt->cyls = 0x50;
            fmt->heads = 2;
            fmt->fdc = PC;
            fmt->datarate = _250K;
            fmt->encoding = MFM;
            fmt->sectors = 8;
            fmt->size = 2;
            fmt->base = 1;
            fmt->offset = 0;
            fmt->interleave = 1;
            fmt->skew = 1;
            fmt->head0 = 0;
            fmt->head1 = 1;
            fmt->gap3 = 0x50;
            fmt->fill = 0xe5;
            fmt->cyls_first = false;
            return true;
          }
          return false;
        }
        iVar2 = 0x28;
      }
      else {
        if (size != 0xb4000) {
          if (size == 0xc8000) {
            fmt->cyls = 0x50;
            fmt->heads = 2;
            fmt->fdc = WD;
            fmt->datarate = _250K;
            fmt->encoding = MFM;
            fmt->sectors = 10;
            fmt->size = 2;
            fmt->base = 1;
            fmt->offset = 0;
            fmt->interleave = 1;
            fmt->skew = 1;
            fmt->head0 = 0;
            fmt->head1 = 1;
            fmt->gap3 = 0x18;
            goto LAB_0015e357;
          }
          if ((char *)size != "8_M_eraseEPSt13_Rb_tree_nodeIS3_E") {
            return false;
          }
          fmt->cyls = 0x50;
          fmt->heads = 2;
          fmt->fdc = PC;
          fmt->datarate = _500K;
          iVar2 = 0xf;
          iVar3 = 2;
          goto LAB_0015e41a;
        }
        iVar2 = 0x50;
      }
      fmt->cyls = iVar2;
      fmt->heads = 2;
      fmt->fdc = PC;
      fmt->datarate = _250K;
      iVar2 = 9;
LAB_0015e3a8:
      fmt->encoding = MFM;
      fmt->sectors = iVar2;
      fmt->size = 2;
      fmt->base = 1;
      fmt->offset = 0;
      fmt->interleave = 1;
      fmt->skew = 1;
      fmt->head0 = 0;
      uVar1 = 0x5000000001;
LAB_0015e433:
      fmt->head1 = (int)uVar1;
      fmt->gap3 = (int)((ulong)uVar1 >> 0x20);
      goto LAB_0015e437;
    }
    if (size < 0x2d000) {
      if (size == 0x23000) {
        fmt->cyls = 0x23;
        fmt->heads = 1;
        fmt->fdc = Apple;
        fmt->datarate = _250K;
        fmt->encoding = Apple;
        fmt->sectors = 0x10;
        fmt->size = 1;
        fmt->base = 0;
        fmt->offset = 0;
        fmt->interleave = 1;
        fmt->skew = 0;
        fmt->head0 = 0;
        fmt->head1 = 1;
        fmt->gap3 = 0;
LAB_0015e357:
        fmt->fill = '\0';
        fmt->cyls_first = false;
        return true;
      }
      if (size != 0x28000) {
        return false;
      }
      fmt->cyls = 0x28;
      fmt->heads = 1;
      iVar2 = 8;
    }
    else {
      if (size != 0x2d000) {
        if (size != 0x50000) {
          return false;
        }
        fmt->cyls = 0x28;
        fmt->heads = 2;
        fmt->fdc = PC;
        fmt->datarate = _250K;
        iVar2 = 8;
        goto LAB_0015e3a8;
      }
      fmt->cyls = 0x28;
      fmt->heads = 1;
      iVar2 = 9;
    }
    fmt->fdc = PC;
    fmt->datarate = _250K;
    fmt->encoding = MFM;
    fmt->sectors = iVar2;
    fmt->size = 2;
    fmt->base = 1;
    fmt->offset = 0;
    fmt->interleave = 1;
    iVar2 = 0x50;
  }
  else {
    if (size < 0x1b3c00) {
      if (size < 0x190000) {
        if (size == 0x134000) {
          fmt->cyls = 0x4d;
          fmt->heads = 2;
          fmt->fdc = PC;
          fmt->datarate = _500K;
          iVar2 = 8;
          iVar3 = 3;
LAB_0015e41a:
          fmt->encoding = MFM;
          fmt->sectors = iVar2;
          fmt->size = iVar3;
          fmt->base = 1;
          fmt->offset = 0;
          fmt->interleave = 1;
          fmt->skew = 1;
          fmt->head0 = 0;
          uVar1 = 0x5400000001;
        }
        else {
          if (size != 0x168000) {
            return false;
          }
          fmt->cyls = 0x50;
          fmt->heads = 2;
          fmt->fdc = PC;
          fmt->datarate = _500K;
          fmt->encoding = MFM;
          fmt->sectors = 0x12;
          fmt->size = 2;
          fmt->base = 1;
          fmt->offset = 0;
          fmt->interleave = 1;
          fmt->skew = 1;
          fmt->head0 = 0;
          uVar1 = 0x6500000001;
        }
        goto LAB_0015e433;
      }
      if (size == 0x190000) {
        fmt->cyls = 0x50;
        fmt->heads = 2;
        fmt->fdc = PC;
        fmt->datarate = _500K;
        uVar1 = 0x1400000001;
      }
      else {
        if (size != 0x1a4000) {
          if ((undefined *)size != &DAT_001ae800) {
            return false;
          }
          fmt->heads = 2;
          fmt->fdc = PC;
          fmt->datarate = _500K;
          fmt->encoding = MFM;
          fmt->size = 2;
          fmt->base = 1;
          fmt->offset = 0;
          fmt->interleave = 1;
          fmt->skew = 1;
          fmt->head0 = 0;
          fmt->head1 = 1;
          fmt->gap3 = 0;
          fmt->fill = 0xf6;
          fmt->cyls_first = false;
          fmt->cyls = 0x52;
          goto LAB_0015e46d;
        }
        fmt->cyls = 0x50;
        fmt->heads = 2;
        fmt->fdc = PC;
        fmt->datarate = _500K;
        uVar1 = 0x1500000001;
      }
    }
    else if (size < 0x1cc000) {
      if ((char *)size ==
          "_Sp_counted_ptr_inplaceI12TrinLoadDiskSaIS0_ELN9__gnu_cxx12_Lock_policyE2EE") {
        fmt->heads = 2;
        fmt->fdc = PC;
        fmt->datarate = _500K;
        fmt->encoding = MFM;
        fmt->size = 2;
        fmt->base = 1;
        fmt->offset = 0;
        fmt->interleave = 1;
        fmt->skew = 1;
        fmt->head0 = 0;
        fmt->head1 = 1;
        fmt->gap3 = 0;
        fmt->fill = 0xf6;
        fmt->cyls_first = false;
        fmt->cyls = 0x53;
LAB_0015e46d:
        fmt->sectors = 0x15;
        return true;
      }
      if (size != 0x1b8000) {
        return false;
      }
      fmt->cyls = 0x50;
      fmt->heads = 2;
      fmt->fdc = PC;
      fmt->datarate = _500K;
      uVar1 = 0x1600000001;
    }
    else if ((dword *)size == &fde_001cc000) {
      fmt->cyls = 0x50;
      fmt->heads = 2;
      fmt->fdc = PC;
      fmt->datarate = _500K;
      uVar1 = 0x1700000001;
    }
    else {
      if (size != 0x1e0000) {
        if (size != 0x2d0000) {
          return false;
        }
        fmt->cyls = 0x50;
        fmt->heads = 2;
        fmt->fdc = PC;
        fmt->datarate = _1M;
        fmt->encoding = MFM;
        fmt->sectors = 0x24;
        fmt->size = 2;
        fmt->base = 1;
        fmt->offset = 0;
        fmt->interleave = 1;
        fmt->skew = 1;
        fmt->head0 = 0;
        uVar1 = 0x5300000001;
        goto LAB_0015e433;
      }
      fmt->cyls = 0x50;
      fmt->heads = 2;
      fmt->fdc = PC;
      fmt->datarate = _500K;
      uVar1 = 0x1800000001;
    }
    fmt->encoding = (int)uVar1;
    fmt->sectors = (int)((ulong)uVar1 >> 0x20);
    fmt->size = 2;
    fmt->base = 1;
    fmt->offset = 0;
    fmt->interleave = 1;
    iVar2 = 0;
  }
  fmt->skew = 1;
  fmt->head0 = 0;
  fmt->head1 = 1;
  fmt->gap3 = iVar2;
LAB_0015e437:
  fmt->fill = 0xf6;
  fmt->cyls_first = false;
  return true;
}

Assistant:

bool Format::FromSize(int64_t size, Format& fmt)
{
    switch (size)
    {
    case 143360:    // Apple ][
        fmt = RegularFormat::DO;
        break;

    case 163840:    // 5.25" SSSD (160K)
        fmt = RegularFormat::PC320;
        fmt.heads = 1;
        break;

    case 184320:    // 5.25" SSSD (180K)
        fmt = RegularFormat::PC360;
        fmt.heads = 1;
        break;

    case 327680:    // 5.25" DSDD (320K)
        fmt = RegularFormat::PC320;
        break;

    case 368640:    // 5.25" DSDD (360K)
        fmt = RegularFormat::PC360;
        break;

    case 655360:    // 3.5"  DSDD (640K)
        fmt = RegularFormat::PC640;
        break;

    case 737280:    // 3.5"  DSDD (720K)
        fmt = RegularFormat::PC720;
        break;

    case 819200:    // MGT (800K), for legacy matching.
        fmt = RegularFormat::MGT;
        break;

    case 1228800:   // 5.25" DSHD (1200K)
        fmt = RegularFormat::PC1200;
        break;

    case 1261568:   // 5.25" DSHD (1232K)
        fmt = RegularFormat::PC1232;
        break;

    case 1474560:   // 3.5"  DSHD (1440K)
        fmt = RegularFormat::PC1440;
        break;

    case 1638400:   // 3.5"  DSHD (1600K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 20;
        fmt.gap3 = 0;
        break;

    case 1720320:   // 3.5"  DSHD (1680K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 21;
        fmt.gap3 = 0;
        break;

    case 1763328:   // 3.5"  DSHD (1722K)
        fmt = RegularFormat::PC1440;
        fmt.cyls = 82;
        fmt.sectors = 21;
        fmt.gap3 = 0;
        break;

    case 1784832:   // 3.5"  DSHD (1743K)
        fmt = RegularFormat::PC1440;
        fmt.cyls = 83;
        fmt.sectors = 21;
        fmt.gap3 = 0;
        break;

    case 1802240:   // 3.5"  DSHD (1760K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 22;
        fmt.gap3 = 0;
        break;

    case 1884160:   // 3.5"  DSHD (1840K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 23;
        fmt.gap3 = 0;
        break;

    case 1966080:   // 3.5"  DSHD (1920K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 24;
        fmt.gap3 = 0;
        break;

    case 2949120:   // 3.5"  DSED (2880K)
        fmt = RegularFormat::PC2880;
        break;

    default:
        return false;
    }

    return true;
}